

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O1

bool __thiscall
TCLAP::ValueArg<int>::processArg
          (ValueArg<int> *this,int *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  Visitor *pVVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  ulong uVar8;
  CmdLineParseException *this_00;
  ArgParseException *pAVar9;
  ulong uVar10;
  string *val;
  bool bVar11;
  string flag;
  string value;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  if (((this->super_Arg)._ignoreable != true) || (Arg::ignoreRestRef()::ign == '\0')) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = pbVar1 + *i;
    uVar8 = pbVar1[*i]._M_string_length;
    bVar11 = 1 < uVar8;
    if (bVar11) {
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      if (pcVar2[1] == '\a') {
        return false;
      }
      uVar5 = 2;
      do {
        uVar10 = uVar5;
        if (uVar8 == uVar10) break;
        uVar5 = uVar10 + 1;
      } while (pcVar2[uVar10] != '\a');
      bVar11 = uVar10 < uVar8;
    }
    if (!bVar11) {
      local_70[0] = local_60;
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar2,pcVar2 + pbVar3->_M_string_length);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      val = &local_50;
      (*(this->super_Arg)._vptr_Arg[10])(this,local_70,val);
      iVar7 = (*(this->super_Arg)._vptr_Arg[6])(this,local_70);
      cVar6 = (char)iVar7;
      if (cVar6 != '\0') {
        if ((this->super_Arg)._alreadySet == true) {
          bVar11 = (this->super_Arg)._xorSet;
          this_00 = (CmdLineParseException *)__cxa_allocate_exception(0x68);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          if (bVar11 == true) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"Mutually exclusive argument already set!","");
            (*(this->super_Arg)._vptr_Arg[7])(&local_90,this);
            CmdLineParseException::CmdLineParseException(this_00,&local_b0,&local_90);
            __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
          }
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Argument already set!","");
          (*(this->super_Arg)._vptr_Arg[7])(&local_90,this);
          CmdLineParseException::CmdLineParseException(this_00,&local_b0,&local_90);
          __cxa_throw(this_00,&CmdLineParseException::typeinfo,ArgException::~ArgException);
        }
        if ((Arg::delimiterRef()::delim != ' ') &&
           (iVar7 = std::__cxx11::string::compare((char *)&local_50), iVar7 == 0)) {
          pAVar9 = (ArgParseException *)__cxa_allocate_exception(0x68);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Couldn\'t find delimiter for this argument!","");
          (*(this->super_Arg)._vptr_Arg[7])(&local_90,this);
          ArgParseException::ArgParseException(pAVar9,&local_b0,&local_90);
          __cxa_throw(pAVar9,&ArgParseException::typeinfo,ArgException::~ArgException);
        }
        iVar7 = std::__cxx11::string::compare((char *)val);
        if (iVar7 == 0) {
          uVar8 = (long)*i + 1;
          *i = (int)uVar8;
          pbVar3 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <=
              (uVar8 & 0xffffffff)) {
            pAVar9 = (ArgParseException *)__cxa_allocate_exception(0x68);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,"Missing a value for this argument!","");
            (*(this->super_Arg)._vptr_Arg[7])(&local_90,this);
            ArgParseException::ArgParseException(pAVar9,&local_b0,&local_90);
            __cxa_throw(pAVar9,&ArgParseException::typeinfo,ArgException::~ArgException);
          }
          val = pbVar3 + uVar8;
        }
        _extractValue(this,val);
        (this->super_Arg)._alreadySet = true;
        pVVar4 = (this->super_Arg)._visitor;
        if (pVVar4 != (Visitor *)0x0) {
          (*pVVar4->_vptr_Visitor[2])();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
        return (bool)cVar6;
      }
      return (bool)cVar6;
    }
  }
  return false;
}

Assistant:

bool ValueArg<T>::processArg(int *i, std::vector<std::string>& args)
{
    if ( _ignoreable && Arg::ignoreRest() )
		return false;

    if ( _hasBlanks( args[*i] ) )
		return false;

    std::string flag = args[*i];

    std::string value = "";
    trimFlag( flag, value );

    if ( argMatches( flag ) )
    {
        if ( _alreadySet )
		{
			if ( _xorSet )
				throw( CmdLineParseException(
				       "Mutually exclusive argument already set!", 
				                             toString()) );
			else
				throw( CmdLineParseException("Argument already set!", 
				                             toString()) );
		}

        if ( Arg::delimiter() != ' ' && value == "" )
			throw( ArgParseException( 
							"Couldn't find delimiter for this argument!",
                             toString() ) );

        if ( value == "" )
        {
            (*i)++;
            if ( static_cast<unsigned int>(*i) < args.size() ) 
				_extractValue( args[*i] );
            else
				throw( ArgParseException("Missing a value for this argument!",
                                                    toString() ) );
        }
        else
			_extractValue( value );
				
        _alreadySet = true;
        _checkWithVisitor();
        return true;
    }	
    else
		return false;
}